

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitAtomicRMW
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,AtomicRMW *curr)

{
  byte bVar1;
  Name memoryName;
  Name memory;
  Name memoryName_00;
  char *this_00;
  Address memorySize;
  Address addr;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  undefined1 local_120 [8];
  Flow ptr;
  Flow value;
  MemoryInstanceInfo info;
  Literal loaded;
  Literal computed;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_120,&this->super_ExpressionRunner<wasm::ModuleRunner>,curr->ptr);
  if (ptr.breakTo.super_IString.str._M_len != 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_120;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&ptr);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)ptr.breakTo.super_IString.str._M_len;
    goto LAB_001b4f2f;
  }
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&ptr.breakTo.super_IString.str._M_str,
             &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->value);
  if (value.breakTo.super_IString.str._M_len == 0) {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)&value.breakTo.super_IString.str._M_str,this,
               (Name)(curr->memory).super_IString.str);
    memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)info.instance;
    memorySize = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)
                               value.breakTo.super_IString.str._M_str,memory);
    this_00 = value.breakTo.super_IString.str._M_str;
    if (((long)((long)ptr.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_120 != 1) {
LAB_001b4f5c:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    wasm::Literal::Literal(&local_168,(Literal *)&ptr);
    addr = getFinalAddress<wasm::AtomicRMW>
                     ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,&local_168,memorySize);
    wasm::Literal::~Literal(&local_168);
    memoryName.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName.super_IString.str._M_len = (size_t)info.instance;
    doAtomicLoad((Literal *)&info.name.super_IString.str._M_str,
                 (ModuleRunnerBase<wasm::ModuleRunner> *)value.breakTo.super_IString.str._M_str,addr
                 ,(uint)curr->bytes,
                 (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                       type.id,memoryName,memorySize);
    if (ptr.breakTo.super_IString.str._M_str +
        ((long)((long)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 != (char *)0x1) goto LAB_001b4f5c;
    wasm::Literal::Literal((Literal *)&loaded.type,(Literal *)&value);
    switch(curr->op) {
    case RMWAdd:
      wasm::Literal::add((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWSub:
      wasm::Literal::sub((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWAnd:
      wasm::Literal::and_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWOr:
      wasm::Literal::or_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    case RMWXor:
      wasm::Literal::xor_((Literal *)&computed.type);
      wasm::Literal::operator=((Literal *)&loaded.type,(Literal *)&computed.type);
      break;
    default:
      goto switchD_001b4de8_default;
    }
    wasm::Literal::~Literal((Literal *)&computed.type);
switchD_001b4de8_default:
    bVar1 = curr->bytes;
    wasm::Literal::Literal(&local_150,(Literal *)&loaded.type);
    memoryName_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memoryName_00.super_IString.str._M_len = (size_t)info.instance;
    doAtomicStore((ModuleRunnerBase<wasm::ModuleRunner> *)value.breakTo.super_IString.str._M_str,
                  addr,(uint)bVar1,&local_150,memoryName_00,memorySize);
    wasm::Literal::~Literal(&local_150);
    wasm::Literal::Literal(&local_138,(Literal *)&info.name.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_138);
    wasm::Literal::~Literal(&local_138);
    wasm::Literal::~Literal((Literal *)&loaded.type);
    wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)ptr.breakTo.super_IString.str._M_str;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&value);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)value.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)value.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &value.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&value);
LAB_001b4f2f:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &ptr.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&ptr);
  return __return_storage_ptr__;
}

Assistant:

Flow visitAtomicRMW(AtomicRMW* curr) {
    NOTE_ENTER("AtomicRMW");
    Flow ptr = self()->visit(curr->ptr);
    if (ptr.breaking()) {
      return ptr;
    }
    auto value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    NOTE_EVAL1(ptr);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto addr =
      info.instance->getFinalAddress(curr, ptr.getSingleValue(), memorySize);
    NOTE_EVAL1(addr);
    NOTE_EVAL1(value);
    auto loaded = info.instance->doAtomicLoad(
      addr, curr->bytes, curr->type, info.name, memorySize);
    NOTE_EVAL1(loaded);
    auto computed = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        computed = loaded.add(computed);
        break;
      case RMWSub:
        computed = loaded.sub(computed);
        break;
      case RMWAnd:
        computed = loaded.and_(computed);
        break;
      case RMWOr:
        computed = loaded.or_(computed);
        break;
      case RMWXor:
        computed = loaded.xor_(computed);
        break;
      case RMWXchg:
        break;
    }
    info.instance->doAtomicStore(
      addr, curr->bytes, computed, info.name, memorySize);
    return loaded;
  }